

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void mpt_drange(double *range,int len,double *val,int ld)

{
  double *pdVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  
  if (len == 0) {
    *range = 0.0;
    range[1] = 0.0;
    return;
  }
  dVar5 = *val;
  uVar3 = SUB84(dVar5,0);
  uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
  range[1] = dVar5;
  *range = dVar5;
  if (1 < len && ld != 0) {
    uVar2 = len + 1;
    pdVar1 = val + ld;
    do {
      dVar6 = *pdVar1;
      if (dVar6 < dVar5) {
        *range = dVar6;
        dVar5 = dVar6;
        dVar6 = *pdVar1;
      }
      if ((double)CONCAT44(uVar4,uVar3) <= dVar6 && dVar6 != (double)CONCAT44(uVar4,uVar3)) {
        range[1] = dVar6;
        uVar3 = SUB84(dVar6,0);
        uVar4 = (undefined4)((ulong)dVar6 >> 0x20);
      }
      uVar2 = uVar2 - 1;
      pdVar1 = pdVar1 + ld;
    } while (2 < uVar2);
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}